

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

POOL_ctx * POOL_create_advanced(size_t numThreads,size_t queueSize,ZSTD_customMem customMem)

{
  int iVar1;
  int iVar2;
  int iVar3;
  POOL_job *pPVar4;
  pthread_t *ppVar5;
  ulong local_80;
  size_t i;
  int error;
  POOL_ctx *ctx;
  size_t queueSize_local;
  size_t numThreads_local;
  
  if (numThreads == 0) {
    numThreads_local = 0;
  }
  else {
    numThreads_local = (size_t)ZSTD_calloc(0xf0,customMem);
    if ((POOL_ctx *)numThreads_local == (POOL_ctx *)0x0) {
      numThreads_local = 0;
    }
    else {
      ((POOL_ctx *)numThreads_local)->queueSize = queueSize + 1;
      pPVar4 = (POOL_job *)ZSTD_malloc(((POOL_ctx *)numThreads_local)->queueSize << 4,customMem);
      ((POOL_ctx *)numThreads_local)->queue = pPVar4;
      ((POOL_ctx *)numThreads_local)->queueHead = 0;
      ((POOL_ctx *)numThreads_local)->queueTail = 0;
      ((POOL_ctx *)numThreads_local)->numThreadsBusy = 0;
      ((POOL_ctx *)numThreads_local)->queueEmpty = 1;
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&((POOL_ctx *)numThreads_local)->queueMutex,
                                 (pthread_mutexattr_t *)0x0);
      iVar2 = pthread_cond_init((pthread_cond_t *)&((POOL_ctx *)numThreads_local)->queuePushCond,
                                (pthread_condattr_t *)0x0);
      iVar3 = pthread_cond_init((pthread_cond_t *)&((POOL_ctx *)numThreads_local)->queuePopCond,
                                (pthread_condattr_t *)0x0);
      if (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0)) {
        ((POOL_ctx *)numThreads_local)->shutdown = 0;
        ppVar5 = (pthread_t *)ZSTD_malloc(numThreads << 3,customMem);
        ((POOL_ctx *)numThreads_local)->threads = ppVar5;
        ((POOL_ctx *)numThreads_local)->threadCapacity = 0;
        (((POOL_ctx *)numThreads_local)->customMem).customAlloc = customMem.customAlloc;
        (((POOL_ctx *)numThreads_local)->customMem).customFree = customMem.customFree;
        (((POOL_ctx *)numThreads_local)->customMem).opaque = customMem.opaque;
        if ((((POOL_ctx *)numThreads_local)->threads == (pthread_t *)0x0) ||
           (((POOL_ctx *)numThreads_local)->queue == (POOL_job *)0x0)) {
          POOL_free((POOL_ctx *)numThreads_local);
          numThreads_local = 0;
        }
        else {
          for (local_80 = 0; local_80 < numThreads; local_80 = local_80 + 1) {
            iVar1 = pthread_create(((POOL_ctx *)numThreads_local)->threads + local_80,
                                   (pthread_attr_t *)0x0,POOL_thread,(void *)numThreads_local);
            if (iVar1 != 0) {
              ((POOL_ctx *)numThreads_local)->threadCapacity = local_80;
              POOL_free((POOL_ctx *)numThreads_local);
              return (POOL_ctx *)0x0;
            }
          }
          ((POOL_ctx *)numThreads_local)->threadCapacity = numThreads;
          ((POOL_ctx *)numThreads_local)->threadLimit = numThreads;
        }
      }
      else {
        POOL_free((POOL_ctx *)numThreads_local);
        numThreads_local = 0;
      }
    }
  }
  return (POOL_ctx *)numThreads_local;
}

Assistant:

POOL_ctx* POOL_create_advanced(size_t numThreads, size_t queueSize,
                               ZSTD_customMem customMem) {
    POOL_ctx* ctx;
    /* Check parameters */
    if (!numThreads) { return NULL; }
    /* Allocate the context and zero initialize */
    ctx = (POOL_ctx*)ZSTD_calloc(sizeof(POOL_ctx), customMem);
    if (!ctx) { return NULL; }
    /* Initialize the job queue.
     * It needs one extra space since one space is wasted to differentiate
     * empty and full queues.
     */
    ctx->queueSize = queueSize + 1;
    ctx->queue = (POOL_job*)ZSTD_malloc(ctx->queueSize * sizeof(POOL_job), customMem);
    ctx->queueHead = 0;
    ctx->queueTail = 0;
    ctx->numThreadsBusy = 0;
    ctx->queueEmpty = 1;
    {
        int error = 0;
        error |= ZSTD_pthread_mutex_init(&ctx->queueMutex, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePushCond, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePopCond, NULL);
        if (error) { POOL_free(ctx); return NULL; }
    }
    ctx->shutdown = 0;
    /* Allocate space for the thread handles */
    ctx->threads = (ZSTD_pthread_t*)ZSTD_malloc(numThreads * sizeof(ZSTD_pthread_t), customMem);
    ctx->threadCapacity = 0;
    ctx->customMem = customMem;
    /* Check for errors */
    if (!ctx->threads || !ctx->queue) { POOL_free(ctx); return NULL; }
    /* Initialize the threads */
    {   size_t i;
        for (i = 0; i < numThreads; ++i) {
            if (ZSTD_pthread_create(&ctx->threads[i], NULL, &POOL_thread, ctx)) {
                ctx->threadCapacity = i;
                POOL_free(ctx);
                return NULL;
        }   }
        ctx->threadCapacity = numThreads;
        ctx->threadLimit = numThreads;
    }
    return ctx;
}